

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O2

void __thiscall DIS::EntityStatePdu::unmarshal(EntityStatePdu *this,DataStream *dataStream)

{
  char cVar1;
  ArticulationParameter x;
  ArticulationParameter local_40;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_forceId);
  DataStream::operator>>(dataStream,&this->_numberOfArticulationParameters);
  EntityType::unmarshal(&this->_entityType,dataStream);
  EntityType::unmarshal(&this->_alternativeEntityType,dataStream);
  Vector3Float::unmarshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::unmarshal(&this->_entityLocation,dataStream);
  Orientation::unmarshal(&this->_entityOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  DeadReckoningParameter::unmarshal(&this->_deadReckoningParameters,dataStream);
  Marking::unmarshal(&this->_marking,dataStream);
  DataStream::operator>>(dataStream,&this->_capabilities);
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::clear
            (&this->_articulationParameters);
  for (cVar1 = '\0'; cVar1 < this->_numberOfArticulationParameters; cVar1 = cVar1 + '\x01') {
    ArticulationParameter::ArticulationParameter(&local_40);
    ArticulationParameter::unmarshal(&local_40,dataStream);
    std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::push_back
              (&this->_articulationParameters,&local_40);
    ArticulationParameter::~ArticulationParameter(&local_40);
  }
  return;
}

Assistant:

void EntityStatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _entityID.unmarshal(dataStream);
    dataStream >> _forceId;
    dataStream >> _numberOfArticulationParameters;
    _entityType.unmarshal(dataStream);
    _alternativeEntityType.unmarshal(dataStream);
    _entityLinearVelocity.unmarshal(dataStream);
    _entityLocation.unmarshal(dataStream);
    _entityOrientation.unmarshal(dataStream);
    dataStream >> _entityAppearance;
    _deadReckoningParameters.unmarshal(dataStream);
    _marking.unmarshal(dataStream);
    dataStream >> _capabilities;

     _articulationParameters.clear();
     for(char idx = 0; idx < _numberOfArticulationParameters; idx++)
     {
        ArticulationParameter x;
        x.unmarshal(dataStream);
        _articulationParameters.push_back(x);
     }
}